

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O0

Vec_Int_t * Gia_ManCollectDoms(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  int local_30;
  int iDomNext;
  int iDom;
  int i;
  int LevMax;
  int Lev;
  Gia_Obj_t *pObj;
  Vec_Int_t *vNodes;
  Gia_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  iDomNext = 0;
  do {
    bVar3 = false;
    if (iDomNext < p->nObjs) {
      _LevMax = Gia_ManObj(p,iDomNext);
      bVar3 = _LevMax != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) {
      Vec_IntUniqify(p_00);
      return p_00;
    }
    if ((((*(ulong *)_LevMax >> 0x3e & 1) != 0) &&
        (((p->pRefs == (int *)0x0 || (iVar1 = Gia_ObjRefNum(p,_LevMax), iVar1 != 0)) &&
         (local_30 = Gia_ObjDom(p,_LevMax), local_30 != -1)))) && (local_30 != iDomNext)) {
      i = 0;
      while( true ) {
        bVar3 = false;
        if (i < 1000000000) {
          pGVar2 = Gia_ManObj(p,local_30);
          iVar1 = Gia_ObjIsAnd(pGVar2);
          bVar3 = iVar1 != 0;
        }
        if (!bVar3) break;
        Vec_IntPush(p_00,local_30);
        pGVar2 = Gia_ManObj(p,local_30);
        iVar1 = Gia_ObjDom(p,pGVar2);
        if (iVar1 == local_30) break;
        i = i + 1;
        local_30 = iVar1;
      }
    }
    iDomNext = iDomNext + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Gia_ManCollectDoms( Gia_Man_t * p )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj;
    int Lev, LevMax = ABC_INFINITY;
    int i, iDom, iDomNext;
    vNodes = Vec_IntAlloc( 100 );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( !pObj->fMark1 )
            continue;
        if ( p->pRefs && Gia_ObjRefNum(p, pObj) == 0 )
            continue;
        iDom = Gia_ObjDom(p, pObj);
        if ( iDom == -1 )
            continue;
        if ( iDom == i )
            continue;
        for ( Lev = 0; Lev < LevMax && Gia_ObjIsAnd( Gia_ManObj(p, iDom) ); Lev++ )
        {
            Vec_IntPush( vNodes, iDom );
            iDomNext = Gia_ObjDom( p, Gia_ManObj(p, iDom) );
            if ( iDomNext == iDom )
                break;
            iDom = iDomNext;
        }
    }
    Vec_IntUniqify( vNodes );
    return vNodes;
}